

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::unparseObject
          (QPDFWriter *this,QPDFObjectHandle *object,int level,int flags,size_t stream_length,
          bool compress)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  logic_error *this_01;
  element_type *peVar7;
  undefined1 *puVar8;
  size_type sVar9;
  longlong lVar10;
  Object *pOVar11;
  size_t sVar12;
  ulong uVar13;
  char *pcVar14;
  uchar *puVar15;
  pointer str;
  RC4_KEY *pRVar16;
  undefined4 in_register_0000000c;
  allocator *indata;
  size_t len;
  string_view sVar17;
  char local_f29;
  bool local_eb3;
  bool local_d62;
  string local_d00;
  string_view local_ce0;
  string_view local_cd0;
  string local_cc0;
  string local_ca0;
  QPDF_String local_c80;
  string local_c60;
  allocator local_c39;
  string local_c38;
  QPDF_String local_c18;
  undefined1 local_bf8 [40];
  uchar *data;
  undefined1 local_bc8 [8];
  RC4 rc4;
  size_t vlen;
  char *tmp;
  unique_ptr<char[],_std::default_delete<char[]>_> tmp_ph;
  QPDF_String local_b80;
  string local_b60;
  undefined1 local_b40 [8];
  Pl_AES_PDF pl;
  Pl_Buffer bufpl;
  undefined1 local_a40 [8];
  string val;
  string_view local_a10;
  string_view local_a00;
  undefined1 local_9f0 [8];
  PipelinePopper pp_enc;
  undefined1 local_9c8 [7];
  char last_char;
  undefined1 local_9b8 [8];
  QPDFObjectHandle stream_dict;
  undefined1 local_998 [8];
  string stream_data;
  bool is_metadata;
  bool compress_stream;
  string_view local_968;
  string_view local_958;
  string_view local_948;
  string_view local_938;
  string_view local_928;
  string_view local_918;
  string local_908;
  string_view local_8e8;
  string local_8d8;
  string_view local_8b8;
  string_view local_8a8;
  string_view local_898;
  string_view local_888;
  QPDFObjectHandle local_878;
  QPDFObjectHandle local_868;
  byte local_853;
  byte local_852;
  allocator<char> local_851;
  string local_850;
  byte local_82b;
  byte local_82a;
  allocator<char> local_829;
  string local_828;
  byte local_803;
  byte local_802;
  allocator<char> local_801;
  string local_800;
  string_view local_7e0;
  string local_7d0;
  string_view local_7b0;
  string_view local_7a0;
  string_view local_790;
  BaseHandle *local_780;
  type *value;
  type *key;
  _Self local_768;
  iterator __end3;
  iterator __begin3;
  Dictionary *__range3;
  int local_730;
  allocator<char> local_729;
  string local_728;
  undefined1 local_708 [8];
  QPDFObjectHandle item_1;
  int local_6f0;
  int i;
  int idx;
  allocator<char> local_6c1;
  string local_6c0;
  allocator<char> local_699;
  string local_698;
  allocator<char> local_671;
  string local_670 [32];
  undefined1 local_650 [8];
  QPDFObjectHandle decode_parms;
  string local_638 [32];
  undefined1 local_618 [8];
  QPDFObjectHandle filter;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  byte local_58c;
  byte local_58b;
  byte local_58a;
  allocator<char> local_589;
  string local_588 [32];
  QPDFObjectHandle local_568;
  allocator<char> local_551;
  string local_550 [32];
  QPDFObjectHandle local_530;
  allocator<char> local_519;
  string local_518;
  allocator<char> local_4f1;
  string local_4f0;
  allocator<char> local_4c9;
  string local_4c8;
  string local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  QPDFObjectHandle local_408;
  allocator<char> local_3f1;
  string local_3f0;
  byte local_3cc;
  byte local_3cb;
  byte local_3ca;
  allocator<char> local_3c9;
  string local_3c8 [32];
  QPDFObjectHandle local_3a8;
  byte local_394;
  byte local_393;
  byte local_392;
  allocator<char> local_391;
  string local_390 [32];
  QPDFObjectHandle local_370;
  byte local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  byte local_334;
  byte local_333;
  byte local_332;
  allocator<char> local_331;
  string local_330 [32];
  QPDFObjectHandle local_310;
  allocator<char> local_2f9;
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  QPDFObjectHandle adbe;
  allocator<char> local_2b1;
  string local_2b0;
  QPDFObjectHandle local_290;
  allocator<char> local_279;
  QPDFObjectHandle local_278 [2];
  QPDFObjectHandle local_258;
  byte local_242;
  allocator<char> local_241;
  undefined1 local_240 [6];
  bool need_extensions_adbe;
  allocator<char> local_219;
  key_type local_218;
  undefined1 local_1f8 [8];
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  string local_1c0 [32];
  QPDFObjectHandle local_1a0;
  byte local_18c;
  byte local_18b;
  byte local_18a;
  allocator<char> local_189;
  string local_188 [32];
  QPDFObjectHandle local_168;
  allocator<char> local_151;
  string local_150;
  undefined1 local_130 [8];
  QPDFObjectHandle extensions;
  undefined1 local_118 [5];
  bool have_extensions_adbe;
  bool have_extensions_other;
  bool is_root;
  string_view local_108;
  string_view local_f8;
  QPDFObjectHandle local_e8;
  string_view local_d8;
  string_view local_c8;
  reference local_b8;
  QPDFObjectHandle *item;
  iterator __end2;
  iterator __begin2;
  Array *__range2;
  qpdf_object_type_e local_70;
  allocator<char> local_69;
  qpdf_object_type_e tc;
  string indent;
  QPDFObjGen QStack_34;
  int child_flags;
  QPDFObjGen old_og;
  bool compress_local;
  size_t stream_length_local;
  int flags_local;
  int level_local;
  QPDFObjectHandle *object_local;
  QPDFWriter *this_local;
  
  puVar15 = (uchar *)CONCAT44(in_register_0000000c,flags);
  old_og.obj._3_1_ = compress;
  unique0x10003963 = stream_length;
  QStack_34 = QPDFObjectHandle::getObjGen(object);
  uVar4 = flags & 0xfffffffe;
  if (level < 0) {
    this_01 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_01,"invalid level in QPDFWriter::unparseObject");
    __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&tc," ",&local_69);
  std::allocator<char>::~allocator(&local_69);
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar7->qdf_mode & 1U) != 0) {
    std::__cxx11::string::append((ulong)&tc,(char)level * '\x02');
    puVar8 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&tc);
    *puVar8 = 10;
  }
  local_70 = QPDFObjectHandle::getTypeCode(object);
  if (local_70 == ot_array) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2,"[");
    writeString(this,___range2);
    QPDFObjectHandle::as_array((Array *)&__begin2,object,any);
    __end2 = ::qpdf::Array::begin((Array *)&__begin2);
    item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin2);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                  *)&item);
      if (!bVar2) break;
      local_b8 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2);
      sVar17 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc);
      local_c8 = sVar17;
      writeString(this,sVar17);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d8,"  ");
      writeStringQDF(this,local_d8);
      QPDFObjectHandle::QPDFObjectHandle(&local_e8,local_b8);
      unparseChild(this,&local_e8,level + 1,uVar4);
      QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    ::qpdf::Array::~Array((Array *)&__begin2);
    local_f8 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc);
    writeString(this,local_f8);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"]");
    writeString(this,local_108);
    goto LAB_0030ec78;
  }
  if (local_70 == ot_dictionary) {
    QPDFObjectHandle::unsafeShallowCopy((QPDFObjectHandle *)local_118);
    QPDFObjectHandle::operator=(object,(QPDFObjectHandle *)local_118);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._7_1_ = QPDFObjGen::operator==(&stack0xffffffffffffffcc,&peVar7->root_og);
    extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._6_1_ = 0;
    extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._5_1_ = 0;
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_130);
    if ((extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) != 0) {
      std::allocator<char>::allocator();
      local_18a = 0;
      local_18b = 0;
      local_18c = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_150,"/Extensions",&local_151);
      bVar2 = QPDFObjectHandle::hasKey(object,&local_150);
      local_d62 = false;
      if (bVar2) {
        std::allocator<char>::allocator();
        local_18a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_188,"/Extensions",&local_189);
        local_18b = 1;
        QPDFObjectHandle::getKey(&local_168,(string *)object);
        local_18c = 1;
        local_d62 = QPDFObjectHandle::isDictionary(&local_168);
      }
      if ((local_18c & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_168);
      }
      if ((local_18b & 1) != 0) {
        std::__cxx11::string::~string(local_188);
      }
      if ((local_18a & 1) != 0) {
        std::allocator<char>::~allocator(&local_189);
      }
      std::__cxx11::string::~string((string *)&local_150);
      std::allocator<char>::~allocator(&local_151);
      if (local_d62 != false) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_1c0,"/Extensions",
                   (allocator<char> *)
                   ((long)&keys._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
        QPDFObjectHandle::getKey(&local_1a0,(string *)object);
        QPDFObjectHandle::operator=((QPDFObjectHandle *)local_130,&local_1a0);
        QPDFObjectHandle::~QPDFObjectHandle(&local_1a0);
        std::__cxx11::string::~string(local_1c0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&keys._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
      }
    }
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_130);
    if (bVar2) {
      QPDFObjectHandle::getKeys_abi_cxx11_
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1f8,(QPDFObjectHandle *)local_130);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"/ADBE",&local_219);
      sVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1f8,&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      if (sVar9 != 0) {
        extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._5_1_ = 1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)local_240,"/ADBE",&local_241);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8,(key_type *)local_240);
        std::__cxx11::string::~string((string *)local_240);
        std::allocator<char>::~allocator(&local_241);
      }
      sVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_1f8);
      if (sVar9 != 0) {
        extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._6_1_ = 1;
      }
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1f8);
    }
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    local_242 = 0 < peVar7->final_extension_level;
    if ((extensions.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._7_1_ & 1) != 0) {
      if ((bool)local_242) {
        if (((extensions.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ & 1
             ) == 0) &&
           ((extensions.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ & 1)
            == 0)) {
          peVar7 = std::
                   __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          QTC::TC("qpdf","QPDFWriter create Extensions",(byte)~peVar7->qdf_mode & 1);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_278,"/Extensions",&local_279);
          QPDFObjectHandle::newDictionary();
          QPDFObjectHandle::replaceKeyAndGetNew(&local_258,(string *)object,local_278);
          QPDFObjectHandle::operator=((QPDFObjectHandle *)local_130,&local_258);
          QPDFObjectHandle::~QPDFObjectHandle(&local_258);
          QPDFObjectHandle::~QPDFObjectHandle(&local_290);
          std::__cxx11::string::~string((string *)local_278);
          std::allocator<char>::~allocator(&local_279);
        }
      }
      else if (((extensions.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
                & 1) == 0) &&
              ((extensions.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ &
               1) != 0)) {
        QTC::TC("qpdf","QPDFWriter remove existing Extensions",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2b0,"/Extensions",&local_2b1);
        QPDFObjectHandle::removeKey(object,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        std::allocator<char>::~allocator(&local_2b1);
        memset(&adbe.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,0,0x10);
        QPDFObjectHandle::QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &adbe.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::operator=
                  ((QPDFObjectHandle *)local_130,
                   (QPDFObjectHandle *)
                   &adbe.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        QPDFObjectHandle::~QPDFObjectHandle
                  ((QPDFObjectHandle *)
                   &adbe.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    bVar2 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_130);
    if (bVar2) {
      QTC::TC("qpdf","QPDFWriter preserve Extensions",0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f8,"/ADBE",&local_2f9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_2d8,(string *)local_130);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      local_332 = 0;
      local_333 = 0;
      local_334 = 0;
      local_359 = 0;
      local_392 = 0;
      local_393 = 0;
      local_394 = 0;
      local_3ca = 0;
      local_3cb = 0;
      local_3cc = 0;
      bVar3 = QPDFObjectHandle::isDictionary((QPDFObjectHandle *)local_2d8);
      bVar2 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_332 = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_330,"/BaseVersion",&local_331);
        local_333 = 1;
        QPDFObjectHandle::getKey(&local_310,(string *)local_2d8);
        local_334 = 1;
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::operator+(&local_358,"/",&peVar7->final_pdf_version);
        local_359 = 1;
        bVar3 = QPDFObjectHandle::isNameAndEquals(&local_310,&local_358);
        bVar2 = false;
        if (bVar3) {
          std::allocator<char>::allocator();
          local_392 = 1;
          std::__cxx11::string::string<std::allocator<char>>(local_390,"/ExtensionLevel",&local_391)
          ;
          local_393 = 1;
          QPDFObjectHandle::getKey(&local_370,(string *)local_2d8);
          local_394 = 1;
          bVar3 = QPDFObjectHandle::isInteger(&local_370);
          bVar2 = false;
          if (bVar3) {
            std::allocator<char>::allocator();
            local_3ca = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      (local_3c8,"/ExtensionLevel",&local_3c9);
            local_3cb = 1;
            QPDFObjectHandle::getKey(&local_3a8,(string *)local_2d8);
            local_3cc = 1;
            lVar10 = QPDFObjectHandle::getIntValue(&local_3a8);
            peVar7 = std::
                     __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            bVar2 = lVar10 == peVar7->final_extension_level;
          }
        }
      }
      if ((local_3cc & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_3a8);
      }
      if ((local_3cb & 1) != 0) {
        std::__cxx11::string::~string(local_3c8);
      }
      if ((local_3ca & 1) != 0) {
        std::allocator<char>::~allocator(&local_3c9);
      }
      if ((local_394 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_370);
      }
      if ((local_393 & 1) != 0) {
        std::__cxx11::string::~string(local_390);
      }
      if ((local_392 & 1) != 0) {
        std::allocator<char>::~allocator(&local_391);
      }
      if ((local_359 & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_358);
      }
      if ((local_334 & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_310);
      }
      if ((local_333 & 1) != 0) {
        std::__cxx11::string::~string(local_330);
      }
      if ((local_332 & 1) != 0) {
        std::allocator<char>::~allocator(&local_331);
      }
      if (bVar2) {
        QTC::TC("qpdf","QPDFWriter preserve ADBE",0);
      }
      else if ((local_242 & 1) == 0) {
        QTC::TC("qpdf","QPDFWriter remove ADBE",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4f0,"/ADBE",&local_4f1);
        QPDFObjectHandle::removeKey((QPDFObjectHandle *)local_130,&local_4f0);
        std::__cxx11::string::~string((string *)&local_4f0);
        std::allocator<char>::~allocator(&local_4f1);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"/ADBE",&local_3f1);
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::operator+(&local_488,"<< /BaseVersion /",&peVar7->final_pdf_version);
        std::operator+(&local_468,&local_488," /ExtensionLevel ");
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::to_string(&local_4a8,peVar7->final_extension_level);
        std::operator+(&local_448,&local_468,&local_4a8);
        std::operator+(&local_428,&local_448," >>");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"",&local_4c9);
        QPDFObjectHandle::parse(&local_408,&local_428,&local_4c8);
        QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_130,&local_3f0,&local_408);
        QPDFObjectHandle::~QPDFObjectHandle(&local_408);
        std::__cxx11::string::~string((string *)&local_4c8);
        std::allocator<char>::~allocator(&local_4c9);
        std::__cxx11::string::~string((string *)&local_428);
        std::__cxx11::string::~string((string *)&local_448);
        std::__cxx11::string::~string((string *)&local_4a8);
        std::__cxx11::string::~string((string *)&local_468);
        std::__cxx11::string::~string((string *)&local_488);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator(&local_3f1);
      }
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_2d8);
    }
    if ((flags & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_518,"/Length",&local_519);
      QPDFObjectHandle::removeKey(object,&local_518);
      std::__cxx11::string::~string((string *)&local_518);
      std::allocator<char>::~allocator(&local_519);
      std::allocator<char>::allocator();
      local_58a = 0;
      local_58b = 0;
      local_58c = 0;
      std::__cxx11::string::string<std::allocator<char>>(local_550,"/DecodeParms",&local_551);
      QPDFObjectHandle::getKey(&local_530,(string *)object);
      bVar3 = QPDFObjectHandle::isArray(&local_530);
      bVar2 = false;
      if (bVar3) {
        std::allocator<char>::allocator();
        local_58a = 1;
        std::__cxx11::string::string<std::allocator<char>>(local_588,"/DecodeParms",&local_589);
        local_58b = 1;
        QPDFObjectHandle::getKey(&local_568,(string *)object);
        local_58c = 1;
        iVar5 = QPDFObjectHandle::getArrayNItems(&local_568);
        bVar2 = iVar5 == 0;
      }
      if ((local_58c & 1) != 0) {
        QPDFObjectHandle::~QPDFObjectHandle(&local_568);
      }
      if ((local_58b & 1) != 0) {
        std::__cxx11::string::~string(local_588);
      }
      if ((local_58a & 1) != 0) {
        std::allocator<char>::~allocator(&local_589);
      }
      QPDFObjectHandle::~QPDFObjectHandle(&local_530);
      std::__cxx11::string::~string(local_550);
      std::allocator<char>::~allocator(&local_551);
      if (bVar2) {
        QTC::TC("qpdf","QPDFWriter remove empty DecodeParms",0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5b0,"/DecodeParms",&local_5b1);
        QPDFObjectHandle::removeKey(object,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        std::allocator<char>::~allocator(&local_5b1);
      }
      if ((flags & 2U) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_638,"/Filter",
                   (allocator<char> *)
                   ((long)&decode_parms.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_618,(string *)object);
        std::__cxx11::string::~string(local_638);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&decode_parms.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_670,"/DecodeParms",&local_671);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)local_650,(string *)object);
        std::__cxx11::string::~string(local_670);
        std::allocator<char>::~allocator(&local_671);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_698,"/Crypt",&local_699)
        ;
        bVar2 = QPDFObjectHandle::isOrHasName((QPDFObjectHandle *)local_618,&local_698);
        std::__cxx11::string::~string((string *)&local_698);
        std::allocator<char>::~allocator(&local_699);
        if (bVar2) {
          bVar2 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_618);
          if (bVar2) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_6c0,"/Filter",&local_6c1);
            QPDFObjectHandle::removeKey(object,&local_6c0);
            std::__cxx11::string::~string((string *)&local_6c0);
            std::allocator<char>::~allocator(&local_6c1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&idx,"/DecodeParms",(allocator<char> *)((long)&i + 3));
            QPDFObjectHandle::removeKey(object,(string *)&idx);
            std::__cxx11::string::~string((string *)&idx);
            std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
          }
          else {
            local_6f0 = -1;
            for (item_1.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
                      = 0;
                iVar5 = item_1.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        ._4_4_,
                iVar6 = QPDFObjectHandle::getArrayNItems((QPDFObjectHandle *)local_618),
                iVar5 < iVar6;
                item_1.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
                     item_1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                     _4_4_ + 1) {
              QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)local_708,(int)local_618);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_728,"/Crypt",&local_729);
              bVar2 = QPDFObjectHandle::isNameAndEquals((QPDFObjectHandle *)local_708,&local_728);
              std::__cxx11::string::~string((string *)&local_728);
              std::allocator<char>::~allocator(&local_729);
              if (bVar2) {
                local_6f0 = item_1.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi._4_4_;
                local_730 = 4;
              }
              else {
                local_730 = 0;
              }
              QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_708);
              if (local_730 != 0) break;
            }
            if (-1 < local_6f0) {
              QTC::TC("qpdf","QPDFWriter remove Crypt",0);
              QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_618,local_6f0);
              QPDFObjectHandle::eraseItem((QPDFObjectHandle *)local_650,local_6f0);
            }
          }
        }
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_650);
        QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_618);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5d8,"/Filter",&local_5d9);
        QPDFObjectHandle::removeKey(object,&local_5d8);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::allocator<char>::~allocator(&local_5d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_600,"/DecodeParms",
                   (allocator<char> *)
                   ((long)&filter.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
        QPDFObjectHandle::removeKey(object,&local_600);
        std::__cxx11::string::~string((string *)&local_600);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&filter.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi + 7));
      }
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range3,"<<");
    writeString(this,___range3);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin3,(typed)object);
    __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin3);
    local_768._M_node =
         (_Base_ptr)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin3);
    while( true ) {
      bVar2 = std::operator!=(&__end3,&local_768);
      if (!bVar2) break;
      key = &std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
             ::operator*(&__end3)->first;
      value = (type *)std::get<0ul,std::__cxx11::string_const,QPDFObjectHandle>
                                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                                  *)key);
      local_780 = &std::get<1ul,std::__cxx11::string_const,QPDFObjectHandle>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                               *)key)->super_BaseHandle;
      bVar2 = ::qpdf::BaseHandle::null(local_780);
      if (!bVar2) {
        sVar17 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc);
        local_790 = sVar17;
        writeString(this,sVar17);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7a0,"  ");
        writeStringQDF(this,local_7a0);
        ::qpdf::Name::normalize(&local_7d0,(string *)value);
        sVar17 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_7d0);
        local_7b0 = sVar17;
        writeString(this,sVar17);
        std::__cxx11::string::~string((string *)&local_7d0);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7e0," ");
        writeString(this,local_7e0);
        local_802 = 0;
        local_803 = 0;
        local_82a = 0;
        local_82b = 0;
        local_852 = 0;
        local_853 = 0;
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )value,"/Contents");
        local_eb3 = false;
        if (bVar2) {
          std::allocator<char>::allocator();
          local_802 = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"/Sig",&local_801)
          ;
          local_803 = 1;
          std::allocator<char>::allocator();
          local_82a = 1;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_828,"",&local_829);
          local_82b = 1;
          bVar2 = QPDFObjectHandle::isDictionaryOfType(object,&local_800,&local_828);
          local_eb3 = false;
          if (bVar2) {
            std::allocator<char>::allocator();
            local_852 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_850,"/ByteRange",&local_851);
            local_853 = 1;
            local_eb3 = QPDFObjectHandle::hasKey(object,&local_850);
          }
        }
        if ((local_853 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_850);
        }
        if ((local_852 & 1) != 0) {
          std::allocator<char>::~allocator(&local_851);
        }
        if ((local_82b & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_828);
        }
        if ((local_82a & 1) != 0) {
          std::allocator<char>::~allocator(&local_829);
        }
        if ((local_803 & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_800);
        }
        if ((local_802 & 1) != 0) {
          std::allocator<char>::~allocator(&local_801);
        }
        if (local_eb3 == false) {
          QPDFObjectHandle::QPDFObjectHandle(&local_878,(QPDFObjectHandle *)local_780);
          unparseChild(this,&local_878,level + 1,uVar4);
          QPDFObjectHandle::~QPDFObjectHandle(&local_878);
        }
        else {
          QTC::TC("qpdf","QPDFWriter no encryption sig contents",0);
          QPDFObjectHandle::QPDFObjectHandle(&local_868,(QPDFObjectHandle *)local_780);
          unparseChild(this,&local_868,level + 1,uVar4 | 0x18);
          QPDFObjectHandle::~QPDFObjectHandle(&local_868);
        }
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end3);
    }
    local_730 = 7;
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin3);
    if ((flags & 1U) != 0) {
      local_888 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc);
      writeString(this,local_888);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_898,"  ");
      writeStringQDF(this,local_898);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_8a8,"/Length ");
      writeString(this,local_8a8);
      peVar7 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar7->direct_stream_lengths & 1U) == 0) {
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        std::__cxx11::to_string(&local_908,peVar7->cur_stream_length_id);
        local_8e8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_908);
        writeString(this,local_8e8);
        std::__cxx11::string::~string((string *)&local_908);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_918," 0 R");
        writeString(this,local_918);
      }
      else {
        std::__cxx11::to_string(&local_8d8,stack0xffffffffffffffd8);
        local_8b8 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_8d8);
        writeString(this,local_8b8);
        std::__cxx11::string::~string((string *)&local_8d8);
      }
      sVar17._M_str = local_928._M_str;
      sVar17._M_len = local_928._M_len;
      if (((old_og.obj._3_1_ & 1) != 0) && (local_928 = sVar17, (flags & 2U) != 0)) {
        local_928 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc);
        writeString(this,local_928);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_938,"  ");
        writeStringQDF(this,local_938);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_948,"/Filter /FlateDecode");
        writeString(this,local_948);
      }
    }
    local_958 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)&tc)
    ;
    writeString(this,local_958);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_968,">>");
    writeString(this,local_968);
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_130);
    goto LAB_0030ec78;
  }
  if (local_70 != ot_stream) {
    if (local_70 != ot_string) {
      QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_d00,object);
      local_ce0 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_d00);
      writeString(this,local_ce0);
      std::__cxx11::string::~string((string *)&local_d00);
      goto LAB_0030ec78;
    }
    std::__cxx11::string::string((string *)local_a40);
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if ((((peVar7->encrypted & 1U) == 0) || ((flags & 4U) != 0)) || ((flags & 0x10U) != 0)) {
LAB_0030eab1:
      if ((flags & 8U) == 0) {
        QPDFObjectHandle::unparseResolved_abi_cxx11_(&local_cc0,object);
        std::__cxx11::string::operator=((string *)local_a40,(string *)&local_cc0);
        std::__cxx11::string::~string((string *)&local_cc0);
      }
      else {
        QPDFObjectHandle::getStringValue_abi_cxx11_(&local_ca0,object);
        QPDF_String::QPDF_String(&local_c80,&local_ca0);
        QPDF_String::unparse_abi_cxx11_(&local_c60,&local_c80,true);
        std::__cxx11::string::operator=((string *)local_a40,(string *)&local_c60);
        std::__cxx11::string::~string((string *)&local_c60);
        QPDF_String::~QPDF_String(&local_c80);
        std::__cxx11::string::~string((string *)&local_ca0);
      }
    }
    else {
      std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)this);
      uVar13 = std::__cxx11::string::empty();
      if ((uVar13 & 1) != 0) goto LAB_0030eab1;
      QPDFObjectHandle::getStringValue_abi_cxx11_((string *)&bufpl.m,object);
      std::__cxx11::string::operator=((string *)local_a40,(string *)&bufpl.m);
      std::__cxx11::string::~string((string *)&bufpl.m);
      peVar7 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      if ((peVar7->encrypt_use_aes & 1U) == 0) {
        QUtil::make_unique_cstr((QUtil *)&tmp,(string *)local_a40);
        str = std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                        ((unique_ptr<char[],_std::default_delete<char[]>_> *)&tmp);
        rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)std::__cxx11::string::length();
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pRVar16 = (RC4_KEY *)QUtil::unsigned_char_pointer(&peVar7->cur_data_key);
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        data = (uchar *)std::__cxx11::string::length();
        uVar4 = QIntC::to_int<unsigned_long>((unsigned_long *)&data);
        RC4::RC4((RC4 *)local_bc8,pRVar16,(ulong)uVar4,puVar15,(uchar *)stream_length);
        local_bf8._32_8_ = QUtil::unsigned_char_pointer(str);
        RC4::process((RC4 *)local_bc8,(uchar *)local_bf8._32_8_,
                     (size_t)rc4.crypto.
                             super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi,(uchar *)local_bf8._32_8_);
        _Var1 = rc4.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
        indata = &local_c39;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c38,str,(ulong)_Var1._M_pi,indata);
        QPDF_String::QPDF_String(&local_c18,&local_c38);
        QPDF_String::unparse_abi_cxx11_((string *)local_bf8,&local_c18,false);
        pRVar16 = (RC4_KEY *)local_bf8;
        std::__cxx11::string::operator=((string *)local_a40,(string *)pRVar16);
        std::__cxx11::string::~string((string *)local_bf8);
        QPDF_String::~QPDF_String(&local_c18);
        std::__cxx11::string::~string((string *)&local_c38);
        std::allocator<char>::~allocator((allocator<char> *)&local_c39);
        RC4::~RC4((RC4 *)local_bc8,pRVar16,len,(uchar *)indata,(uchar *)stream_length);
        std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
                  ((unique_ptr<char[],_std::default_delete<char[]>_> *)&tmp);
      }
      else {
        Pl_Buffer::Pl_Buffer((Pl_Buffer *)&pl.use_zero_iv,"encrypted string",(Pipeline *)0x0);
        peVar7 = std::
                 __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        puVar15 = QUtil::unsigned_char_pointer(&peVar7->cur_data_key);
        std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)this);
        sVar12 = std::__cxx11::string::length();
        Pl_AES_PDF::Pl_AES_PDF
                  ((Pl_AES_PDF *)local_b40,"aes encrypt string",(Pipeline *)&pl.use_zero_iv,true,
                   puVar15,sVar12);
        Pipeline::writeString((Pipeline *)local_b40,(string *)local_a40);
        Pl_AES_PDF::finish((Pl_AES_PDF *)local_b40);
        Pl_Buffer::getString_abi_cxx11_((string *)&tmp_ph,(Pl_Buffer *)&pl.use_zero_iv);
        QPDF_String::QPDF_String(&local_b80,(string *)&tmp_ph);
        QPDF_String::unparse_abi_cxx11_(&local_b60,&local_b80,true);
        std::__cxx11::string::operator=((string *)local_a40,(string *)&local_b60);
        std::__cxx11::string::~string((string *)&local_b60);
        QPDF_String::~QPDF_String(&local_b80);
        std::__cxx11::string::~string((string *)&tmp_ph);
        Pl_AES_PDF::~Pl_AES_PDF((Pl_AES_PDF *)local_b40);
        Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&pl.use_zero_iv);
      }
    }
    local_cd0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a40);
    writeString(this,local_cd0);
    std::__cxx11::string::~string((string *)local_a40);
    goto LAB_0030ec78;
  }
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar7->direct_stream_lengths & 1U) == 0) {
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    pOVar11 = ObjTable<QPDFWriter::Object>::operator[]
                        (&(peVar7->obj).super_ObjTable<QPDFWriter::Object>,QStack_34);
    iVar5 = pOVar11->renumber;
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar7->cur_stream_length_id = iVar5 + 1;
  }
  stream_length_local._0_4_ = flags | 1;
  stream_data.field_2._M_local_buf[0xf] = '\0';
  stream_data.field_2._M_local_buf[0xe] = '\0';
  std::__cxx11::string::string((string *)local_998);
  this_00 = &stream_dict.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)this_00,object);
  bVar2 = willFilterStream(this,(QPDFObjectHandle *)this_00,
                           (bool *)(stream_data.field_2._M_local_buf + 0xf),
                           (bool *)(stream_data.field_2._M_local_buf + 0xe),(string *)local_998);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &stream_dict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (bVar2) {
    stream_length_local._0_4_ = flags | 3;
  }
  QPDFObjectHandle::getDict((QPDFObjectHandle *)local_9b8);
  sVar12 = std::__cxx11::string::size();
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  peVar7->cur_stream_length = sVar12;
  if ((((stream_data.field_2._M_local_buf[0xe] & 1U) != 0) &&
      (peVar7 = std::
                __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)this), (peVar7->encrypted & 1U) != 0)) &&
     (peVar7 = std::
               __shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this), (peVar7->encrypt_metadata & 1U) == 0)) {
    std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )this);
    std::__cxx11::string::clear();
  }
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  adjustAESStreamLength(this,&peVar7->cur_stream_length);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_9c8,(QPDFObjectHandle *)local_9b8);
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  unparseObject(this,(QPDFObjectHandle *)local_9c8,0,(uint)stream_length_local,
                peVar7->cur_stream_length,(bool)(stream_data.field_2._M_local_buf[0xf] & 1));
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_9c8);
  uVar13 = std::__cxx11::string::empty();
  if ((uVar13 & 1) == 0) {
    pcVar14 = (char *)std::__cxx11::string::back();
    local_f29 = *pcVar14;
  }
  else {
    local_f29 = '\0';
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&pp_enc.stack_id,"\nstream\n");
  writeString(this,stack0xfffffffffffff620);
  PipelinePopper::PipelinePopper((PipelinePopper *)local_9f0,this);
  pushEncryptionFilter(this,(PipelinePopper *)local_9f0);
  local_a00 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_998);
  writeString(this,local_a00);
  PipelinePopper::~PipelinePopper((PipelinePopper *)local_9f0);
  peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar7->newline_before_endstream & 1U) == 0) {
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    if (((peVar7->qdf_mode & 1U) != 0) && (local_f29 != '\n')) goto LAB_0030e4e1;
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar7->added_newline = false;
  }
  else {
LAB_0030e4e1:
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a10,"\n");
    writeString(this,local_a10);
    peVar7 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar7->added_newline = true;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&val.field_2 + 8),
             "endstream");
  writeString(this,stack0xfffffffffffff5e0);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_9b8);
  std::__cxx11::string::~string((string *)local_998);
LAB_0030ec78:
  std::__cxx11::string::~string((string *)&tc);
  return;
}

Assistant:

void
QPDFWriter::unparseObject(
    QPDFObjectHandle object, int level, int flags, size_t stream_length, bool compress)
{
    QPDFObjGen old_og = object.getObjGen();
    int child_flags = flags & ~f_stream;
    if (level < 0) {
        throw std::logic_error("invalid level in QPDFWriter::unparseObject");
    }
    // For non-qdf, "indent" is a single space between tokens. For qdf, indent includes the
    // preceding newline.
    std::string indent = " ";
    if (m->qdf_mode) {
        indent.append(static_cast<size_t>(2 * level), ' ');
        indent[0] = '\n';
    }

    if (auto const tc = object.getTypeCode(); tc == ::ot_array) {
        // Note: PDF spec 1.4 implementation note 121 states that Acrobat requires a space after the
        // [ in the /H key of the linearization parameter dictionary.  We'll do this unconditionally
        // for all arrays because it looks nicer and doesn't make the files that much bigger.
        writeString("[");
        for (auto const& item: object.as_array()) {
            writeString(indent);
            writeStringQDF("  ");
            unparseChild(item, level + 1, child_flags);
        }
        writeString(indent);
        writeString("]");
    } else if (tc == ::ot_dictionary) {
        // Make a shallow copy of this object so we can modify it safely without affecting the
        // original. This code has logic to skip certain keys in agreement with prepareFileForWrite
        // and with skip_stream_parameters so that replacing them doesn't leave unreferenced objects
        // in the output. We can use unsafeShallowCopy here because all we are doing is removing or
        // replacing top-level keys.
        object = object.unsafeShallowCopy();

        // Handle special cases for specific dictionaries.

        // Extensions dictionaries.

        // We have one of several cases:
        //
        // * We need ADBE
        //    - We already have Extensions
        //       - If it has the right ADBE, preserve it
        //       - Otherwise, replace ADBE
        //    - We don't have Extensions: create one from scratch
        // * We don't want ADBE
        //    - We already have Extensions
        //       - If it only has ADBE, remove it
        //       - If it has other things, keep those and remove ADBE
        //    - We have no extensions: no action required
        //
        // Before writing, we guarantee that /Extensions, if present, is direct through the ADBE
        // dictionary, so we can modify in place.

        const bool is_root = (old_og == m->root_og);
        bool have_extensions_other = false;
        bool have_extensions_adbe = false;

        QPDFObjectHandle extensions;
        if (is_root) {
            if (object.hasKey("/Extensions") && object.getKey("/Extensions").isDictionary()) {
                extensions = object.getKey("/Extensions");
            }
        }

        if (extensions) {
            std::set<std::string> keys = extensions.getKeys();
            if (keys.count("/ADBE") > 0) {
                have_extensions_adbe = true;
                keys.erase("/ADBE");
            }
            if (keys.size() > 0) {
                have_extensions_other = true;
            }
        }

        bool need_extensions_adbe = (m->final_extension_level > 0);

        if (is_root) {
            if (need_extensions_adbe) {
                if (!(have_extensions_other || have_extensions_adbe)) {
                    // We need Extensions and don't have it.  Create it here.
                    QTC::TC("qpdf", "QPDFWriter create Extensions", m->qdf_mode ? 0 : 1);
                    extensions = object.replaceKeyAndGetNew(
                        "/Extensions", QPDFObjectHandle::newDictionary());
                }
            } else if (!have_extensions_other) {
                // We have Extensions dictionary and don't want one.
                if (have_extensions_adbe) {
                    QTC::TC("qpdf", "QPDFWriter remove existing Extensions");
                    object.removeKey("/Extensions");
                    extensions = QPDFObjectHandle(); // uninitialized
                }
            }
        }

        if (extensions) {
            QTC::TC("qpdf", "QPDFWriter preserve Extensions");
            QPDFObjectHandle adbe = extensions.getKey("/ADBE");
            if (adbe.isDictionary() &&
                adbe.getKey("/BaseVersion").isNameAndEquals("/" + m->final_pdf_version) &&
                adbe.getKey("/ExtensionLevel").isInteger() &&
                (adbe.getKey("/ExtensionLevel").getIntValue() == m->final_extension_level)) {
                QTC::TC("qpdf", "QPDFWriter preserve ADBE");
            } else {
                if (need_extensions_adbe) {
                    extensions.replaceKey(
                        "/ADBE",
                        QPDFObjectHandle::parse(
                            "<< /BaseVersion /" + m->final_pdf_version + " /ExtensionLevel " +
                            std::to_string(m->final_extension_level) + " >>"));
                } else {
                    QTC::TC("qpdf", "QPDFWriter remove ADBE");
                    extensions.removeKey("/ADBE");
                }
            }
        }

        // Stream dictionaries.

        if (flags & f_stream) {
            // Suppress /Length since we will write it manually
            object.removeKey("/Length");

            // If /DecodeParms is an empty list, remove it.
            if (object.getKey("/DecodeParms").isArray() &&
                (0 == object.getKey("/DecodeParms").getArrayNItems())) {
                QTC::TC("qpdf", "QPDFWriter remove empty DecodeParms");
                object.removeKey("/DecodeParms");
            }

            if (flags & f_filtered) {
                // We will supply our own filter and decode
                // parameters.
                object.removeKey("/Filter");
                object.removeKey("/DecodeParms");
            } else {
                // Make sure, no matter what else we have, that we don't have /Crypt in the output
                // filters.
                QPDFObjectHandle filter = object.getKey("/Filter");
                QPDFObjectHandle decode_parms = object.getKey("/DecodeParms");
                if (filter.isOrHasName("/Crypt")) {
                    if (filter.isName()) {
                        object.removeKey("/Filter");
                        object.removeKey("/DecodeParms");
                    } else {
                        int idx = -1;
                        for (int i = 0; i < filter.getArrayNItems(); ++i) {
                            QPDFObjectHandle item = filter.getArrayItem(i);
                            if (item.isNameAndEquals("/Crypt")) {
                                idx = i;
                                break;
                            }
                        }
                        if (idx >= 0) {
                            // If filter is an array, then the code in QPDF_Stream has already
                            // verified that DecodeParms and Filters are arrays of the same length,
                            // but if they weren't for some reason, eraseItem does type and bounds
                            // checking.
                            QTC::TC("qpdf", "QPDFWriter remove Crypt");
                            filter.eraseItem(idx);
                            decode_parms.eraseItem(idx);
                        }
                    }
                }
            }
        }

        writeString("<<");

        for (auto const& [key, value]: object.as_dictionary()) {
            if (!value.null()) {
                writeString(indent);
                writeStringQDF("  ");
                writeString(Name::normalize(key));
                writeString(" ");
                if (key == "/Contents" && object.isDictionaryOfType("/Sig") &&
                    object.hasKey("/ByteRange")) {
                    QTC::TC("qpdf", "QPDFWriter no encryption sig contents");
                    unparseChild(value, level + 1, child_flags | f_hex_string | f_no_encryption);
                } else {
                    unparseChild(value, level + 1, child_flags);
                }
            }
        }

        if (flags & f_stream) {
            writeString(indent);
            writeStringQDF("  ");
            writeString("/Length ");

            if (m->direct_stream_lengths) {
                writeString(std::to_string(stream_length));
            } else {
                writeString(std::to_string(m->cur_stream_length_id));
                writeString(" 0 R");
            }
            if (compress && (flags & f_filtered)) {
                writeString(indent);
                writeStringQDF("  ");
                writeString("/Filter /FlateDecode");
            }
        }

        writeString(indent);
        writeString(">>");
    } else if (tc == ::ot_stream) {
        // Write stream data to a buffer.
        if (!m->direct_stream_lengths) {
            m->cur_stream_length_id = m->obj[old_og].renumber + 1;
        }

        flags |= f_stream;
        bool compress_stream = false;
        bool is_metadata = false;
        std::string stream_data;
        if (willFilterStream(object, compress_stream, is_metadata, &stream_data)) {
            flags |= f_filtered;
        }
        QPDFObjectHandle stream_dict = object.getDict();

        m->cur_stream_length = stream_data.size();
        if (is_metadata && m->encrypted && (!m->encrypt_metadata)) {
            // Don't encrypt stream data for the metadata stream
            m->cur_data_key.clear();
        }
        adjustAESStreamLength(m->cur_stream_length);
        unparseObject(stream_dict, 0, flags, m->cur_stream_length, compress_stream);
        char last_char = stream_data.empty() ? '\0' : stream_data.back();
        writeString("\nstream\n");
        {
            PipelinePopper pp_enc(this);
            pushEncryptionFilter(pp_enc);
            writeString(stream_data);
        }

        if (m->newline_before_endstream || (m->qdf_mode && last_char != '\n')) {
            writeString("\n");
            m->added_newline = true;
        } else {
            m->added_newline = false;
        }
        writeString("endstream");
    } else if (tc == ::ot_string) {
        std::string val;
        if (m->encrypted && (!(flags & f_in_ostream)) && (!(flags & f_no_encryption)) &&
            (!m->cur_data_key.empty())) {
            val = object.getStringValue();
            if (m->encrypt_use_aes) {
                Pl_Buffer bufpl("encrypted string");
                Pl_AES_PDF pl(
                    "aes encrypt string",
                    &bufpl,
                    true,
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    m->cur_data_key.length());
                pl.writeString(val);
                pl.finish();
                val = QPDF_String(bufpl.getString()).unparse(true);
            } else {
                auto tmp_ph = QUtil::make_unique_cstr(val);
                char* tmp = tmp_ph.get();
                size_t vlen = val.length();
                RC4 rc4(
                    QUtil::unsigned_char_pointer(m->cur_data_key),
                    QIntC::to_int(m->cur_data_key.length()));
                auto data = QUtil::unsigned_char_pointer(tmp);
                rc4.process(data, vlen, data);
                val = QPDF_String(std::string(tmp, vlen)).unparse();
            }
        } else if (flags & f_hex_string) {
            val = QPDF_String(object.getStringValue()).unparse(true);
        } else {
            val = object.unparseResolved();
        }
        writeString(val);
    } else {
        writeString(object.unparseResolved());
    }
}